

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O1

pair<QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>::iterator,_bool>
* __thiscall
QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
::try_emplace<>(pair<QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>::iterator,_bool>
                *__return_storage_ptr__,
               QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
               *this,QString *key)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  QString *pQVar4;
  iterator pQVar5;
  long lVar6;
  size_type sVar7;
  QStringView QVar8;
  QStringView QVar9;
  
  pvVar1 = (this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.ptr;
  pQVar4 = std::
           __lower_bound<QString_const*,QString,__gnu_cxx::__ops::_Iter_comp_val<std::less<QString>>>
                     (pvVar1,(void *)((long)pvVar1 +
                                     (this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.s *
                                     0x18));
  pvVar1 = (this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.ptr;
  lVar6 = (long)pQVar4 - (long)pvVar1;
  sVar7 = (lVar6 >> 3) * -0x5555555555555555;
  if (sVar7 - (this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.s != 0) {
    QVar8.m_data = (key->d).ptr;
    QVar8.m_size = (key->d).size;
    QVar9.m_data = *(storage_type_conflict **)((long)pvVar1 + lVar6 + 8);
    QVar9.m_size = *(qsizetype *)((long)pvVar1 + lVar6 + 0x10);
    iVar3 = QtPrivate::compareStrings(QVar8,QVar9,CaseSensitive);
    if (-1 < iVar3) {
      bVar2 = false;
      goto LAB_002828f6;
    }
  }
  QVarLengthArray<QIconTheme,_5LL>::emplace<>
            (&(this->c).values,
             (const_iterator)
             ((lVar6 >> 3) * 0x5555555555555578 +
             (long)(this->c).values.super_QVLABase<QIconTheme>.super_QVLABaseBase.ptr));
  pQVar5 = QVLABase<QString>::insert_impl
                     ((QVLABase<QString> *)this,5,&(this->c).keys.super_QVLAStorage<24UL,_8UL,_5LL>,
                      (const_iterator)
                      (lVar6 + (long)(this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.ptr),
                      1,key);
  sVar7 = ((long)pQVar5 - (long)(this->c).keys.super_QVLABase<QString>.super_QVLABaseBase.ptr >> 3)
          * -0x5555555555555555;
  bVar2 = true;
LAB_002828f6:
  (__return_storage_ptr__->first).c = &this->c;
  (__return_storage_ptr__->first).i = sVar7;
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }